

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

void glfwSetInputMode(GLFWwindow *handle,int mode,int value)

{
  GLFWbool GVar1;
  long lVar2;
  ulong uVar3;
  uint enabled;
  char *pcVar4;
  int code;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  char cVar7;
  
  if (_glfw.initialized == 0) {
    code = 0x10001;
    pcVar4 = (char *)0x0;
LAB_00239c6f:
    _glfwInputError(code,pcVar4);
    return;
  }
  uVar3 = (ulong)(uint)mode;
  switch(mode) {
  case 0x33001:
    if (value - 0x34004U < 0xfffffffd) {
      pcVar4 = "Invalid cursor mode 0x%08X";
      uVar3 = (ulong)(uint)value;
      goto LAB_00239e5e;
    }
    if (*(int *)(handle + 0x7c) != value) {
      *(int *)(handle + 0x7c) = value;
      _glfwPlatformGetCursorPos
                ((_GLFWwindow *)handle,(double *)(handle + 0x1e8),(double *)(handle + 0x1f0));
      _glfwPlatformSetCursorMode((_GLFWwindow *)handle,value);
      return;
    }
    break;
  case 0x33002:
    if (*(uint *)(handle + 0x70) != (uint)(value != 0)) {
      if (value == 0) {
        lVar2 = 0x88;
        do {
          if (handle[lVar2] == (GLFWwindow)0x3) {
            handle[lVar2] = (GLFWwindow)0x0;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0x1e5);
      }
      *(uint *)(handle + 0x70) = (uint)(value != 0);
    }
    break;
  case 0x33003:
    if (*(uint *)(handle + 0x74) != (uint)(value != 0)) {
      if (value == 0) {
        uVar3 = *(ulong *)(handle + 0x80);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar3;
        if ((char)uVar3 == '\x03') {
          handle[0x80] = (GLFWwindow)0x0;
        }
        auVar6[1] = -((char)uVar3 == '\0');
        auVar6[0] = 0xff;
        auVar6[2] = -((char)(uVar3 >> 8) == '\x03');
        auVar6[3] = -((char)(uVar3 >> 0x10) == '\x03');
        auVar6[4] = 0xff;
        cVar7 = (char)(uVar3 >> 0x20);
        auVar6[5] = -(cVar7 == '\0');
        auVar6[6] = -((char)(uVar3 >> 0x28) == '\0');
        auVar6[7] = -((char)(uVar3 >> 0x30) == '\0');
        auVar6[8] = 0xff;
        auVar6[9] = 0xff;
        auVar6[10] = 0xff;
        auVar6[0xb] = 0xff;
        auVar6[0xc] = 0xff;
        auVar6[0xd] = 0xff;
        auVar6[0xe] = 0xff;
        auVar6[0xf] = 0xff;
        if ((auVar6[2] & 1) != 0) {
          handle[0x81] = (GLFWwindow)0x0;
        }
        auVar5 = pshuflw(auVar6,auVar5,0x55);
        if (auVar5[4] == '\x03') {
          handle[0x82] = (GLFWwindow)0x0;
        }
        if ((char)(uVar3 >> 0x18) == '\x03') {
          handle[0x83] = (GLFWwindow)0x0;
        }
        if (cVar7 == '\0') {
          handle[0x84] = (GLFWwindow)0x0;
        }
        handle[0x85] = (GLFWwindow)0x0;
        handle[0x86] = (GLFWwindow)0x0;
        handle[0x87] = (GLFWwindow)0x0;
      }
      *(uint *)(handle + 0x74) = (uint)(value != 0);
    }
    break;
  case 0x33004:
    *(uint *)(handle + 0x78) = (uint)(value != 0);
    break;
  case 0x33005:
    GVar1 = _glfwPlatformRawMouseMotionSupported();
    if (GVar1 == 0) {
      pcVar4 = "Raw mouse motion is not supported on this system";
      code = 0x10008;
      goto LAB_00239c6f;
    }
    enabled = (uint)(value != 0);
    if (*(uint *)(handle + 0x1f8) != enabled) {
      *(uint *)(handle + 0x1f8) = enabled;
      _glfwPlatformSetRawMouseMotion((_GLFWwindow *)handle,enabled);
      return;
    }
    break;
  default:
    pcVar4 = "Invalid input mode 0x%08X";
LAB_00239e5e:
    _glfwInputError(0x10003,pcVar4,uVar3);
    return;
  }
  return;
}

Assistant:

GLFWAPI void glfwSetInputMode(GLFWwindow* handle, int mode, int value)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (mode == GLFW_CURSOR)
    {
        if (value != GLFW_CURSOR_NORMAL &&
            value != GLFW_CURSOR_HIDDEN &&
            value != GLFW_CURSOR_DISABLED)
        {
            _glfwInputError(GLFW_INVALID_ENUM,
                            "Invalid cursor mode 0x%08X",
                            value);
            return;
        }

        if (window->cursorMode == value)
            return;

        window->cursorMode = value;

        _glfwPlatformGetCursorPos(window,
                                  &window->virtualCursorPosX,
                                  &window->virtualCursorPosY);
        _glfwPlatformSetCursorMode(window, value);
    }
    else if (mode == GLFW_STICKY_KEYS)
    {
        value = value ? GLFW_TRUE : GLFW_FALSE;
        if (window->stickyKeys == value)
            return;

        if (!value)
        {
            int i;

            // Release all sticky keys
            for (i = 0;  i <= GLFW_KEY_LAST;  i++)
            {
                if (window->keys[i] == _GLFW_STICK)
                    window->keys[i] = GLFW_RELEASE;
            }
        }

        window->stickyKeys = value;
    }
    else if (mode == GLFW_STICKY_MOUSE_BUTTONS)
    {
        value = value ? GLFW_TRUE : GLFW_FALSE;
        if (window->stickyMouseButtons == value)
            return;

        if (!value)
        {
            int i;

            // Release all sticky mouse buttons
            for (i = 0;  i <= GLFW_MOUSE_BUTTON_LAST;  i++)
            {
                if (window->mouseButtons[i] == _GLFW_STICK)
                    window->mouseButtons[i] = GLFW_RELEASE;
            }
        }

        window->stickyMouseButtons = value;
    }
    else if (mode == GLFW_LOCK_KEY_MODS)
    {
        window->lockKeyMods = value ? GLFW_TRUE : GLFW_FALSE;
    }
    else if (mode == GLFW_RAW_MOUSE_MOTION)
    {
        if (!_glfwPlatformRawMouseMotionSupported())
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "Raw mouse motion is not supported on this system");
            return;
        }

        value = value ? GLFW_TRUE : GLFW_FALSE;
        if (window->rawMouseMotion == value)
            return;

        window->rawMouseMotion = value;
        _glfwPlatformSetRawMouseMotion(window, value);
    }
    else
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid input mode 0x%08X", mode);
}